

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_avx2.c
# Opt level: O2

void aom_compute_flow_at_point_avx2
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint8_t *puVar15;
  undefined1 (*pauVar16) [32];
  int iVar17;
  int iVar18;
  undefined1 (*pauVar19) [16];
  undefined4 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  int16_t dy [64];
  int16_t dx [64];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 auStack_200 [16];
  undefined1 auStack_1f0 [144];
  undefined1 auStack_160 [128];
  undefined1 auStack_e0 [176];
  
  auVar7 = _DAT_0046f6e0;
  auVar6 = _DAT_0046f6c0;
  uVar8 = (ulong)stride;
  lVar10 = (long)(stride * y + x);
  pauVar19 = (undefined1 (*) [16])(src + lVar10 + -1);
  auVar30._0_16_ =
       ZEXT116(0) * *pauVar19 + ZEXT116(1) * *(undefined1 (*) [16])(src + ~uVar8 + lVar10);
  auVar30._16_16_ = ZEXT116(1) * *pauVar19;
  auVar43 = vpshufb_avx2(auVar30,_DAT_0046f7c0);
  auVar33 = vpunpcklbw_avx2(auVar30,ZEXT1632((undefined1  [16])0x0));
  auVar25 = vpshufb_avx2(auVar30,_DAT_0046f7e0);
  auVar30 = vpaddw_avx2(auVar25,auVar33);
  auVar43 = vpaddw_avx2(auVar43,auVar43);
  auVar30 = vpaddw_avx2(auVar30,auVar43);
  auVar43 = vpsubw_avx2(auVar33,auVar25);
  lVar10 = uVar8 * 2;
  lVar11 = 0;
  auVar25._16_16_ = _DAT_0046f820;
  auVar25._0_16_ = _DAT_0046f820;
  auVar33._16_16_ = _DAT_0046f830;
  auVar33._0_16_ = _DAT_0046f830;
  uVar14 = 0;
  while (uVar14 < 8) {
    uVar14 = uVar14 + 2;
    auVar41._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar19 + uVar8 * 2) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar19 + uVar8);
    auVar41._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar19 + uVar8 * 2);
    auVar31 = vpunpcklbw_avx2(auVar41,ZEXT1632((undefined1  [16])0x0));
    auVar52 = vpshufb_avx2(auVar41,auVar25);
    auVar57 = vpshufb_avx2(auVar41,auVar33);
    auVar41 = vpaddw_avx2(auVar57,auVar31);
    auVar52 = vpaddw_avx2(auVar52,auVar52);
    auVar41 = vpaddw_avx2(auVar41,auVar52);
    auVar57 = vpsubw_avx2(auVar31,auVar57);
    auVar52 = vpaddw_avx2(auVar57,auVar43);
    auVar43 = vperm2i128_avx2(auVar43,auVar57,0x21);
    auVar43 = vpaddw_avx2(auVar43,auVar43);
    auVar43 = vpaddw_avx2(auVar52,auVar43);
    auVar30 = vpsubw_avx2(auVar30,auVar41);
    *(undefined1 (*) [32])(auStack_e0 + lVar11) = auVar43;
    *(undefined1 (*) [32])(auStack_160 + lVar11) = auVar30;
    pauVar19 = (undefined1 (*) [16])(*pauVar19 + lVar10);
    lVar11 = lVar11 + 0x20;
    auVar30 = auVar41;
    auVar43 = auVar57;
  }
  auVar26 = ZEXT1664((undefined1  [16])0x0);
  lVar11 = 0;
  uVar14 = 0;
  auVar34 = ZEXT1664((undefined1  [16])0x0);
  auVar42 = ZEXT1664((undefined1  [16])0x0);
  while( true ) {
    auVar30 = auVar34._0_32_;
    if (7 < uVar14) break;
    auVar43 = *(undefined1 (*) [32])(auStack_e0 + lVar11);
    auVar25 = *(undefined1 (*) [32])(auStack_160 + lVar11);
    auVar33 = vpmaddwd_avx2(auVar43,auVar43);
    auVar33 = vpaddd_avx2(auVar33,auVar26._0_32_);
    auVar26 = ZEXT3264(auVar33);
    auVar43 = vpmaddwd_avx2(auVar43,auVar25);
    auVar30 = vpaddd_avx2(auVar43,auVar30);
    auVar34 = ZEXT3264(auVar30);
    auVar30 = vpmaddwd_avx2(auVar25,auVar25);
    auVar30 = vpaddd_avx2(auVar30,auVar42._0_32_);
    auVar42 = ZEXT3264(auVar30);
    uVar14 = uVar14 + 2;
    lVar11 = lVar11 + 0x20;
  }
  auVar43 = vphaddd_avx2(auVar26._0_32_,auVar30);
  auVar30 = vphaddd_avx2(auVar30,auVar42._0_32_);
  auVar30 = vphaddd_avx2(auVar43,auVar30);
  auVar4 = vpaddd_avx(auVar30._16_16_,auVar30._0_16_);
  auVar4 = vpaddd_avx(auVar4,_DAT_0046e660);
  auVar30 = vcvtdq2pd_avx(auVar4);
  auVar4 = vshufpd_avx(auVar30._16_16_,auVar30._16_16_,1);
  auVar5 = vshufpd_avx(auVar30._0_16_,auVar30._0_16_,1);
  dVar44 = 1.0 / (auVar30._0_8_ * auVar4._0_8_ - auVar30._16_8_ * auVar5._0_8_);
  iVar17 = 0;
  auVar43._16_16_ = _DAT_0046f840;
  auVar43._0_16_ = _DAT_0046f840;
  auVar45 = ZEXT816(0xc000000000000000);
  do {
    if (iVar17 == 4) {
      return;
    }
    dVar1 = *u;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar1;
    auVar23 = vroundsd_avx(auVar47,auVar47,9);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = *v;
    auVar54 = vroundsd_avx(auVar54,auVar54,9);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar1 - auVar23._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = *v - auVar54._0_8_;
    auVar47 = vunpcklpd_avx(auVar48,auVar55);
    dVar2 = auVar47._0_8_;
    auVar56._0_8_ = dVar2 * dVar2;
    dVar3 = auVar47._8_8_;
    auVar56._8_8_ = dVar3 * dVar3;
    auVar49._0_8_ = dVar2 * 0.5;
    auVar49._8_8_ = dVar3 * 0.5;
    auVar47 = vsubpd_avx(auVar56,auVar49);
    auVar21._0_8_ = dVar2 * auVar56._0_8_ * 0.5;
    auVar21._8_8_ = dVar3 * auVar56._8_8_ * 0.5;
    auVar47 = vsubpd_avx(auVar47,auVar21);
    auVar35._0_8_ = dVar2 * auVar56._0_8_ * 1.5;
    auVar35._8_8_ = dVar3 * auVar56._8_8_ * 1.5;
    auVar50._0_8_ = auVar49._0_8_ + auVar56._0_8_ + auVar56._0_8_;
    auVar50._8_8_ = auVar49._8_8_ + auVar56._8_8_ + auVar56._8_8_;
    auVar48 = vsubpd_avx(auVar50,auVar35);
    auVar51._0_8_ = auVar56._0_8_ * 0.5;
    auVar51._8_8_ = auVar56._8_8_ * 0.5;
    auVar49 = vsubpd_avx(auVar21,auVar51);
    auVar46._0_8_ = auVar47._0_8_ * 16384.0;
    auVar46._8_8_ = auVar47._8_8_ * 16384.0;
    auVar47 = vroundpd_avx(auVar46,8);
    auVar27._0_8_ = (auVar56._0_8_ * -2.5 + 1.0 + auVar35._0_8_) * 16384.0;
    auVar27._8_8_ = (auVar56._8_8_ * -2.5 + 1.0 + auVar35._8_8_) * 16384.0;
    auVar21 = vroundpd_avx(auVar27,8);
    auVar36._0_8_ = auVar48._0_8_ * 16384.0;
    auVar36._8_8_ = auVar48._8_8_ * 16384.0;
    auVar48 = vroundpd_avx(auVar36,8);
    auVar22._0_8_ = auVar49._0_8_ * 16384.0;
    auVar22._8_8_ = auVar49._8_8_ * 16384.0;
    auVar49 = vroundpd_avx(auVar22,8);
    auVar47 = vcvtpd2dq_avx(auVar47);
    auVar21 = vcvtpd2dq_avx(auVar21);
    auVar48 = vcvtpd2dq_avx(auVar48);
    auVar49 = vcvtpd2dq_avx(auVar49);
    iVar18 = (int)auVar23._0_8_ + x;
    iVar9 = width;
    if (iVar18 < width) {
      iVar9 = iVar18;
    }
    iVar9 = iVar9 + -1;
    iVar12 = (int)auVar54._0_8_ + y;
    iVar13 = height;
    if (iVar12 < height) {
      iVar13 = iVar12;
    }
    auVar47 = vpunpckldq_avx(auVar47,auVar21);
    if (iVar12 < -9) {
      iVar13 = -9;
    }
    auVar21 = vpunpckldq_avx(auVar48,auVar49);
    if (iVar18 < -9) {
      iVar9 = -10;
    }
    auVar47 = vpackssdw_avx(auVar47,auVar21);
    uVar20 = auVar47._0_4_;
    auVar52._4_4_ = uVar20;
    auVar52._0_4_ = uVar20;
    auVar52._8_4_ = uVar20;
    auVar52._12_4_ = uVar20;
    auVar52._16_4_ = uVar20;
    auVar52._20_4_ = uVar20;
    auVar52._24_4_ = uVar20;
    auVar52._28_4_ = uVar20;
    auVar21 = vpackssdw_avx(auVar21,auVar21);
    uVar20 = auVar21._0_4_;
    auVar57._4_4_ = uVar20;
    auVar57._0_4_ = uVar20;
    auVar57._8_4_ = uVar20;
    auVar57._12_4_ = uVar20;
    auVar57._16_4_ = uVar20;
    auVar57._20_4_ = uVar20;
    auVar57._24_4_ = uVar20;
    auVar57._28_4_ = uVar20;
    puVar15 = ref + iVar9;
    pauVar16 = (undefined1 (*) [32])local_220;
    for (lVar11 = -1; lVar11 < 10; lVar11 = lVar11 + 2) {
      auVar31._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(puVar15 + (long)iVar13 * uVar8) +
           ZEXT116(1) * *(undefined1 (*) [16])(puVar15 + ((long)iVar13 + -1) * uVar8);
      auVar31._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(puVar15 + (long)iVar13 * uVar8);
      auVar33 = vpunpcklbw_avx2(auVar31,ZEXT1632(ZEXT816(0)));
      auVar41 = vpshufb_avx2(auVar31,auVar43);
      auVar25 = vpshufb_avx2(auVar33,auVar6);
      auVar33 = vpshufb_avx2(auVar33,auVar7);
      auVar25 = vpmaddwd_avx2(auVar52,auVar25);
      auVar33 = vpmaddwd_avx2(auVar57,auVar33);
      auVar25 = vpaddd_avx2(auVar25,auVar33);
      auVar40._8_4_ = 0x80;
      auVar40._0_8_ = 0x8000000080;
      auVar40._12_4_ = 0x80;
      auVar40._16_4_ = 0x80;
      auVar40._20_4_ = 0x80;
      auVar40._24_4_ = 0x80;
      auVar40._28_4_ = 0x80;
      auVar25 = vpaddd_avx2(auVar25,auVar40);
      auVar31 = vpsrad_avx2(auVar25,8);
      auVar25 = vpshufb_avx2(auVar41,auVar6);
      auVar33 = vpshufb_avx2(auVar41,auVar7);
      auVar25 = vpmaddwd_avx2(auVar25,auVar52);
      auVar33 = vpmaddwd_avx2(auVar57,auVar33);
      auVar25 = vpaddd_avx2(auVar25,auVar33);
      auVar25 = vpaddd_avx2(auVar25,auVar40);
      auVar25 = vpsrad_avx2(auVar25,8);
      auVar25 = vpackssdw_avx2(auVar31,auVar25);
      *pauVar16 = auVar25;
      pauVar16 = pauVar16 + 1;
      puVar15 = puVar15 + lVar10;
    }
    auVar21 = vpshufd_avx(auVar47,0x55);
    uVar20 = auVar21._0_4_;
    auVar53._4_4_ = uVar20;
    auVar53._0_4_ = uVar20;
    auVar53._8_4_ = uVar20;
    auVar53._12_4_ = uVar20;
    auVar53._16_4_ = uVar20;
    auVar53._20_4_ = uVar20;
    auVar53._24_4_ = uVar20;
    auVar53._28_4_ = uVar20;
    auVar47 = vpshufd_avx(auVar47,0xff);
    uVar20 = auVar47._0_4_;
    auVar58._4_4_ = uVar20;
    auVar58._0_4_ = uVar20;
    auVar58._8_4_ = uVar20;
    auVar58._12_4_ = uVar20;
    auVar58._16_4_ = uVar20;
    auVar58._20_4_ = uVar20;
    auVar58._24_4_ = uVar20;
    auVar58._28_4_ = uVar20;
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    lVar11 = 0;
    uVar14 = 0;
    auVar34 = ZEXT1664(ZEXT816(0));
    puVar15 = src + x;
    while( true ) {
      if (7 < uVar14) break;
      auVar25 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_220 + lVar11),
                                *(undefined1 (*) [32])(auStack_210 + lVar11));
      auVar25 = vpmaddwd_avx2(auVar53,auVar25);
      auVar33 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_200 + lVar11),
                                *(undefined1 (*) [32])(auStack_1f0 + lVar11));
      auVar33 = vpmaddwd_avx2(auVar33,auVar58);
      auVar25 = vpaddd_avx2(auVar33,auVar25);
      auVar33 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_220 + lVar11),
                                *(undefined1 (*) [32])(auStack_210 + lVar11));
      auVar33 = vpmaddwd_avx2(auVar53,auVar33);
      auVar41 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_200 + lVar11),
                                *(undefined1 (*) [32])(auStack_1f0 + lVar11));
      auVar41 = vpmaddwd_avx2(auVar58,auVar41);
      auVar33 = vpaddd_avx2(auVar33,auVar41);
      auVar32._8_4_ = 0x10000;
      auVar32._0_8_ = 0x1000000010000;
      auVar32._12_4_ = 0x10000;
      auVar32._16_4_ = 0x10000;
      auVar32._20_4_ = 0x10000;
      auVar32._24_4_ = 0x10000;
      auVar32._28_4_ = 0x10000;
      auVar25 = vpaddd_avx2(auVar25,auVar32);
      auVar41 = vpsrad_avx2(auVar25,0x11);
      auVar25 = vpaddd_avx2(auVar33,auVar32);
      auVar25 = vpsrad_avx2(auVar25,0x11);
      auVar25 = vpackssdw_avx2(auVar41,auVar25);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(puVar15 + ((long)y + 1) * uVar8);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(puVar15 + uVar8 * (long)y);
      auVar47 = vpunpcklqdq_avx(auVar37,auVar28);
      auVar33 = vpmovzxbw_avx2(auVar47);
      auVar33 = vpsllw_avx2(auVar33,3);
      auVar33 = vpsubw_avx2(auVar25,auVar33);
      auVar25 = vpmaddwd_avx2(auVar33,*(undefined1 (*) [32])(auStack_e0 + lVar11));
      auVar25 = vpaddd_avx2(auVar34._0_32_,auVar25);
      auVar34 = ZEXT3264(auVar25);
      auVar25 = vpmaddwd_avx2(auVar33,*(undefined1 (*) [32])(auStack_160 + lVar11));
      auVar25 = vpaddd_avx2(auVar26._0_32_,auVar25);
      auVar26 = ZEXT3264(auVar25);
      uVar14 = uVar14 + 2;
      puVar15 = puVar15 + lVar10;
      lVar11 = lVar11 + 0x20;
    }
    auVar25 = vphaddd_avx2(auVar34._0_32_,auVar26._0_32_);
    auVar47 = vpaddd_avx(auVar25._0_16_,auVar25._16_16_);
    auVar21 = vphaddd_avx(auVar47,auVar47);
    auVar47 = vcvtdq2pd_avx(auVar21);
    auVar21 = vpshufd_avx(auVar21,0xff);
    auVar21 = vcvtdq2pd_avx(auVar21);
    dVar2 = auVar47._0_8_ * auVar4._0_8_ * dVar44 + auVar21._0_8_ * dVar44 * -auVar5._0_8_;
    dVar3 = auVar47._0_8_ * dVar44 * -auVar30._16_8_ + auVar21._0_8_ * auVar30._0_8_ * dVar44;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar2;
    auVar21 = vminsd_avx(ZEXT816(0x4000000000000000),auVar38);
    auVar47 = vcmpsd_avx(auVar38,auVar45,1);
    auVar47 = vblendvpd_avx(auVar21,auVar45,auVar47);
    *u = dVar1 + auVar47._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar3;
    auVar21 = vminsd_avx(ZEXT816(0x4000000000000000),auVar23);
    auVar47 = vcmpsd_avx(auVar23,auVar45,1);
    auVar47 = vblendvpd_avx(auVar21,auVar45,auVar47);
    *v = auVar47._0_8_ + *v;
    auVar29._8_8_ = 0x7fffffffffffffff;
    auVar29._0_8_ = 0x7fffffffffffffff;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar2;
    auVar47 = vandpd_avx(auVar39,auVar29);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar3;
    auVar21 = vandpd_avx(auVar24,auVar29);
    iVar17 = iVar17 + 1;
  } while (0.125 <= auVar47._0_8_ + auVar21._0_8_);
  return;
}

Assistant:

void aom_compute_flow_at_point_avx2(const uint8_t *src, const uint8_t *ref,
                                    int x, int y, int width, int height,
                                    int stride, double *u, double *v) {
  DECLARE_ALIGNED(32, double, M[4]);
  DECLARE_ALIGNED(32, double, M_inv[4]);
  DECLARE_ALIGNED(32, int16_t, dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  DECLARE_ALIGNED(32, int16_t, dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  int b[2];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, dy);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}